

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bnll.cpp
# Opt level: O2

int __thiscall ncnn::BNLL::forward_inplace(BNLL *this,Mat *bottom_top_blob,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  
  uVar3 = bottom_top_blob->h * bottom_top_blob->w;
  sVar1 = bottom_top_blob->cstep;
  sVar2 = bottom_top_blob->elemsize;
  uVar8 = 0;
  uVar4 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar4 = uVar8;
  }
  uVar6 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar6 = uVar8;
  }
  pvVar7 = bottom_top_blob->data;
  for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      fVar10 = *(float *)((long)pvVar7 + uVar5 * 4);
      if (fVar10 <= 0.0) {
        fVar10 = expf(fVar10);
        fVar9 = logf(fVar10 + 1.0);
      }
      else {
        fVar9 = expf(-fVar10);
        fVar9 = logf(fVar9 + 1.0);
        fVar9 = fVar9 + fVar10;
      }
      *(float *)((long)pvVar7 + uVar5 * 4) = fVar9;
    }
    pvVar7 = (void *)((long)pvVar7 + sVar1 * sVar2);
  }
  return 0;
}

Assistant:

int BNLL::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] > 0)
                ptr[i] = ptr[i] + logf(1.f + expf(-ptr[i]));
            else
                ptr[i] = logf(1.f + expf(ptr[i]));
        }
    }

    return 0;
}